

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

Block * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block<(moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *this)

{
  ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *pCVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict2 _Var3;
  ulong uVar4;
  uint uVar5;
  Block *pBVar6;
  __pointer_type pBVar7;
  __pointer_type pBVar8;
  Block *pBVar9;
  bool bVar10;
  
  if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
    LOCK();
    pCVar1 = this + 0x10;
    uVar4 = *(ulong *)pCVar1;
    *(ulong *)pCVar1 = *(ulong *)pCVar1 + 1;
    UNLOCK();
    if (*(long *)(this + 0x18) != 0 && uVar4 < *(ulong *)(this + 0x20)) {
      return (Block *)(*(long *)(this + 0x18) + uVar4 * 0xd0);
    }
  }
  pBVar9 = *(Block **)(this + 0x28);
joined_r0x0014c5f6:
  do {
    pBVar6 = pBVar9;
    if (pBVar6 == (Block *)0x0) {
      pBVar9 = (Block *)malloc(0xd0);
      if (pBVar9 == (Block *)0x0) {
        pBVar9 = (Block *)0x0;
      }
      else {
        (pBVar9->freeListRefs).super___atomic_base<unsigned_int>._M_i = 0;
        (pBVar9->freeListNext)._M_b._M_p = (__pointer_type)0x0;
        pBVar9->shouldBeOnFreeList = (__atomic_base<bool>)0x0;
        pBVar9->dynamicallyAllocated = true;
        pBVar9->next = (Block *)0x0;
        (pBVar9->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
      }
      return pBVar9;
    }
    uVar5 = (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if ((uVar5 & 0x7fffffff) == 0) {
LAB_0014c67d:
      pBVar9 = *(Block **)(this + 0x28);
      goto joined_r0x0014c5f6;
    }
    LOCK();
    bVar10 = uVar5 == (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if (bVar10) {
      (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar5 + 1;
    }
    UNLOCK();
    if (!bVar10) goto LAB_0014c67d;
    LOCK();
    pBVar9 = *(Block **)(this + 0x28);
    bVar10 = pBVar6 == pBVar9;
    if (bVar10) {
      *(__pointer_type *)(this + 0x28) = (pBVar6->freeListNext)._M_b._M_p;
      pBVar9 = pBVar6;
    }
    UNLOCK();
    if (bVar10) {
      if (-1 < (int)(pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i) {
        LOCK();
        (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i =
             (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
        UNLOCK();
        return pBVar6;
      }
      __assert_fail("(head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                    ,0x574,
                    "N *moodycamel::ConcurrentQueue<unsigned int>::FreeList<moodycamel::ConcurrentQueue<unsigned int>::Block>::try_get() [T = unsigned int, Traits = moodycamel::ConcurrentQueueDefaultTraits, N = moodycamel::ConcurrentQueue<unsigned int>::Block]"
                   );
    }
    LOCK();
    paVar2 = &pBVar6->freeListRefs;
    _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if (_Var3 == 0x80000001) {
      pBVar7 = *(__pointer_type *)(this + 0x28);
      do {
        (pBVar6->freeListNext)._M_b._M_p = pBVar7;
        (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
        LOCK();
        pBVar8 = *(__pointer_type *)(this + 0x28);
        bVar10 = pBVar7 == pBVar8;
        if (bVar10) {
          *(Block **)(this + 0x28) = pBVar6;
          pBVar8 = pBVar7;
        }
        UNLOCK();
        if (bVar10) break;
        LOCK();
        paVar2 = &pBVar6->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
        UNLOCK();
        pBVar7 = pBVar8;
      } while (_Var3 == 1);
    }
  } while( true );
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}